

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

QVariant * QSettingsPrivate::stringToVariant(QVariant *__return_storage_ptr__,QString *s)

{
  char16_t cVar1;
  char16_t *pcVar2;
  bool bVar3;
  pointer pQVar4;
  qlonglong qVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  storage_type_conflict *psVar9;
  qsizetype objectSize;
  ulong uVar10;
  QArrayData *data;
  int in_R8D;
  uint uVar11;
  int iVar12;
  long in_FS_OFFSET;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QStringView string;
  QStringView string_00;
  QStringView string_01;
  QStringView string_02;
  QRect r;
  QLatin1StringView s_05;
  QStringView string_03;
  QStringView string_04;
  QLatin1StringView s_06;
  QStringView string_05;
  QStringView string_06;
  QLatin1StringView s_07;
  QStringView string_07;
  QStringView string_08;
  QLatin1StringView rhs;
  QStringView lhs;
  QByteArray local_78;
  undefined1 local_58 [24];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QString::startsWith(s,(QChar)0x40,CaseSensitive);
  if (bVar3) {
    bVar3 = QString::endsWith(s,(QChar)0x29,CaseSensitive);
    if (bVar3) {
      psVar9 = (storage_type_conflict *)0x1;
      s_00.m_data = "@ByteArray(";
      s_00.m_size = 0xb;
      bVar3 = QString::startsWith(s,s_00,CaseSensitive);
      if (bVar3) {
        string_07.m_size = (s->d).ptr + 0xb;
        string_07.m_data = psVar9;
        QtPrivate::convertToLatin1
                  ((QByteArray *)local_58,(QtPrivate *)((s->d).size + -0xc),string_07);
        ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)local_58);
        if ((QArrayData *)local_58._0_8_ == (QArrayData *)0x0) goto LAB_00436043;
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar8 = (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        data = (QArrayData *)local_58._0_8_;
      }
      else {
        s_01.m_data = "@String(";
        s_01.m_size = 8;
        bVar3 = QString::startsWith(s,s_01,CaseSensitive);
        if (bVar3) {
          QString::QString((QString *)local_58,(QChar *)((s->d).ptr + 8),(s->d).size + -9);
          goto LAB_0043600a;
        }
        s_02.m_data = "@Variant(";
        s_02.m_size = 9;
        bVar3 = QString::startsWith(s,s_02,CaseSensitive);
        if ((!bVar3) &&
           (s_03.m_data = "@DateTime(", s_03.m_size = 10,
           bVar3 = QString::startsWith(s,s_03,CaseSensitive), !bVar3)) {
          s_04.m_data = "@Rect(";
          s_04.m_size = 6;
          bVar3 = QString::startsWith(s,s_04,CaseSensitive);
          if (bVar3) {
            local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            splitArgs((QStringList *)local_58,s,5);
            if ((undefined1 *)local_58._16_8_ == (undefined1 *)0x4) {
              pQVar4 = QList<QString>::data((QList<QString> *)local_58);
              string.m_data = (storage_type_conflict *)0x0;
              string.m_size = (qsizetype)(pQVar4->d).ptr;
              qVar5 = QString::toIntegral_helper
                                ((QString *)(pQVar4->d).size,string,(bool *)0xa,in_R8D);
              uVar11 = 0;
              if ((int)(uint)qVar5 == qVar5) {
                uVar11 = (uint)qVar5;
              }
              pQVar4 = QList<QString>::data((QList<QString> *)local_58);
              uVar7 = 0;
              string_00.m_data = (storage_type_conflict *)0x0;
              string_00.m_size = (qsizetype)pQVar4[1].d.ptr;
              uVar6 = QString::toIntegral_helper
                                ((QString *)pQVar4[1].d.size,string_00,(bool *)0xa,in_R8D);
              if ((long)(int)uVar6 == uVar6) {
                uVar7 = uVar6 & 0xffffffff;
              }
              pQVar4 = QList<QString>::data((QList<QString> *)local_58);
              string_01.m_data = (storage_type_conflict *)0x0;
              string_01.m_size = (qsizetype)pQVar4[2].d.ptr;
              qVar5 = QString::toIntegral_helper
                                ((QString *)pQVar4[2].d.size,string_01,(bool *)0xa,in_R8D);
              iVar8 = 0;
              if ((int)qVar5 == qVar5) {
                iVar8 = (int)qVar5;
              }
              pQVar4 = QList<QString>::data((QList<QString> *)local_58);
              string_02.m_data = (storage_type_conflict *)0x0;
              string_02.m_size = (qsizetype)pQVar4[3].d.ptr;
              qVar5 = QString::toIntegral_helper
                                ((QString *)pQVar4[3].d.size,string_02,(bool *)0xa,in_R8D);
              iVar12 = 0;
              if ((int)qVar5 == qVar5) {
                iVar12 = (int)qVar5;
              }
              r.x2.m_i = uVar11 + iVar8 + -1;
              r._0_8_ = (ulong)uVar11 | uVar7 << 0x20;
              r.y2.m_i = iVar12 + (int)uVar7 + -1;
              ::QVariant::QVariant(__return_storage_ptr__,r);
              QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58)
              ;
              goto LAB_00436043;
            }
          }
          else {
            s_05.m_data = "@Size(";
            s_05.m_size = 6;
            bVar3 = QString::startsWith(s,s_05,CaseSensitive);
            if (bVar3) {
              local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              splitArgs((QStringList *)local_58,s,5);
              if ((undefined1 *)local_58._16_8_ == (undefined1 *)0x2) {
                pQVar4 = QList<QString>::data((QList<QString> *)local_58);
                string_03.m_data = (storage_type_conflict *)0x0;
                string_03.m_size = (qsizetype)(pQVar4->d).ptr;
                uVar7 = QString::toIntegral_helper
                                  ((QString *)(pQVar4->d).size,string_03,(bool *)0xa,in_R8D);
                pQVar4 = QList<QString>::data((QList<QString> *)local_58);
                string_04.m_data = (storage_type_conflict *)0x0;
                string_04.m_size = (qsizetype)pQVar4[1].d.ptr;
                qVar5 = QString::toIntegral_helper
                                  ((QString *)pQVar4[1].d.size,string_04,(bool *)0xa,in_R8D);
                uVar6 = qVar5 << 0x20;
                if ((int)qVar5 != qVar5) {
                  uVar6 = 0;
                }
                uVar10 = uVar7 & 0xffffffff;
                if (uVar7 + 0x80000000 >> 0x20 != 0) {
                  uVar10 = 0;
                }
                ::QVariant::QVariant(__return_storage_ptr__,(QSize)(uVar10 | uVar6));
LAB_00435fb5:
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_58);
                goto LAB_00436043;
              }
            }
            else {
              s_06.m_data = "@Point(";
              s_06.m_size = 7;
              bVar3 = QString::startsWith(s,s_06,CaseSensitive);
              if (!bVar3) {
                if (((s->d).size == 10) &&
                   (rhs.m_data = "@Invalid()", rhs.m_size = 10, lhs.m_data = (s->d).ptr,
                   lhs.m_size = 10, bVar3 = QtPrivate::equalStrings(lhs,rhs), bVar3)) {
                  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
                  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
                  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
                  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
                  goto LAB_00436043;
                }
                goto LAB_00435fd1;
              }
              local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              splitArgs((QStringList *)local_58,s,6);
              if ((undefined1 *)local_58._16_8_ == (undefined1 *)0x2) {
                pQVar4 = QList<QString>::data((QList<QString> *)local_58);
                string_05.m_data = (storage_type_conflict *)0x0;
                string_05.m_size = (qsizetype)(pQVar4->d).ptr;
                uVar7 = QString::toIntegral_helper
                                  ((QString *)(pQVar4->d).size,string_05,(bool *)0xa,in_R8D);
                pQVar4 = QList<QString>::data((QList<QString> *)local_58);
                string_06.m_data = (storage_type_conflict *)0x0;
                string_06.m_size = (qsizetype)pQVar4[1].d.ptr;
                qVar5 = QString::toIntegral_helper
                                  ((QString *)pQVar4[1].d.size,string_06,(bool *)0xa,in_R8D);
                uVar6 = qVar5 << 0x20;
                if ((int)qVar5 != qVar5) {
                  uVar6 = 0;
                }
                uVar10 = uVar7 & 0xffffffff;
                if (uVar7 + 0x80000000 >> 0x20 != 0) {
                  uVar10 = 0;
                }
                ::QVariant::QVariant(__return_storage_ptr__,(QPoint)(uVar10 | uVar6));
                goto LAB_00435fb5;
              }
            }
          }
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
          goto LAB_00435fd1;
        }
        pcVar2 = (s->d).ptr;
        cVar1 = pcVar2[1];
        uVar6 = (ulong)(cVar1 == L'D');
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        string_08.m_size = pcVar2 + uVar6 + 9;
        string_08.m_data._0_1_ = cVar1 == L'D';
        string_08.m_data._1_7_ = 0;
        QtPrivate::convertToLatin1(&local_78,(QtPrivate *)((s->d).size - (uVar6 + 9)),string_08);
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QDataStream::QDataStream((QDataStream *)local_58,&local_78,(OpenMode)0x1);
        iVar8 = 7;
        if (cVar1 == L'D') {
          iVar8 = 0x11;
        }
        puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,iVar8);
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
        ::operator>>((QDataStream *)local_58,__return_storage_ptr__);
        QDataStream::~QDataStream((QDataStream *)local_58);
        if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00436043;
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar8 = ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        data = &(local_78.d.d)->super_QArrayData;
      }
      if (iVar8 != 0) goto LAB_00436043;
      objectSize = 1;
    }
    else {
LAB_00435fd1:
      s_07.m_data = "@@";
      s_07.m_size = 2;
      bVar3 = QString::startsWith(s,s_07,CaseSensitive);
      if (!bVar3) goto LAB_00436038;
      QString::QString((QString *)local_58,(QChar *)((s->d).ptr + 1),(s->d).size + -1);
LAB_0043600a:
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_58);
      if ((QArrayData *)local_58._0_8_ == (QArrayData *)0x0) goto LAB_00436043;
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i != 0)
      goto LAB_00436043;
      objectSize = 2;
      data = (QArrayData *)local_58._0_8_;
    }
    QArrayData::deallocate(data,objectSize,0x10);
  }
  else {
LAB_00436038:
    ::QVariant::QVariant(__return_storage_ptr__,s);
  }
LAB_00436043:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QSettingsPrivate::stringToVariant(const QString &s)
{
    if (s.startsWith(u'@')) {
        if (s.endsWith(u')')) {
            if (s.startsWith("@ByteArray("_L1)) {
                return QVariant(QStringView{s}.sliced(11).chopped(1).toLatin1());
            } else if (s.startsWith("@String("_L1)) {
                return QVariant(QStringView{s}.sliced(8).chopped(1).toString());
            } else if (s.startsWith("@Variant("_L1)
                       || s.startsWith("@DateTime("_L1)) {
#ifndef QT_NO_DATASTREAM
                QDataStream::Version version;
                int offset;
                if (s.at(1) == u'D') {
                    version = QDataStream::Qt_5_6;
                    offset = 10;
                } else {
                    version = QDataStream::Qt_4_0;
                    offset = 9;
                }
                QByteArray a = QStringView{s}.sliced(offset).toLatin1();
                QDataStream stream(&a, QIODevice::ReadOnly);
                stream.setVersion(version);
                QVariant result;
                stream >> result;
                return result;
#else
                Q_ASSERT(!"QSettings: Cannot load custom types without QDataStream support");
#endif
            } else if (s.startsWith("@Rect("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 5);
                if (args.size() == 4)
                    return QVariant(QRect(args[0].toInt(), args[1].toInt(), args[2].toInt(), args[3].toInt()));
            } else if (s.startsWith("@Size("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 5);
                if (args.size() == 2)
                    return QVariant(QSize(args[0].toInt(), args[1].toInt()));
            } else if (s.startsWith("@Point("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 6);
                if (args.size() == 2)
                    return QVariant(QPoint(args[0].toInt(), args[1].toInt()));
            } else if (s == "@Invalid()"_L1) {
                return QVariant();
            }

        }
        if (s.startsWith("@@"_L1))
            return QVariant(s.sliced(1));
    }

    return QVariant(s);
}